

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaching-definitions-transfer-function.h
# Opt level: O2

void __thiscall
wasm::analysis::ReachingDefinitionsTransferFunction::visitLocalGet
          (ReachingDefinitionsTransferFunction *this,LocalGet *curr)

{
  bool bVar1;
  mapped_type *this_00;
  value_type pLVar2;
  iterator iVar3;
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  *this_01;
  LocalSet **x;
  ulong uVar4;
  long lVar5;
  value_type pLVar6;
  Iterator IVar7;
  LocalGet *local_80;
  LocalGet *curr_local;
  ulong local_70;
  ulong local_68;
  FinitePowersetLattice<wasm::LocalSet_*> *local_60;
  mapped_type *local_58;
  _Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_50;
  LocalSet *local_48;
  value_type setInstance;
  ReachingDefinitionsTransferFunction *local_38;
  
  local_80 = curr;
  if ((this->
      super_VisitorTransferFunc<wasm::analysis::ReachingDefinitionsTransferFunction,_wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_(wasm::analysis::AnalysisDirection)0>
      ).currState != (Element *)0x0) {
    if ((this->
        super_VisitorTransferFunc<wasm::analysis::ReachingDefinitionsTransferFunction,_wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_(wasm::analysis::AnalysisDirection)0>
        ).collectingResults == true) {
      this_00 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::SmallVector<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_wasm::SmallVector<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::SmallVector<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_wasm::SmallVector<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->indexSetses,(key_type *)(curr + 0x10));
      IVar7 = SmallVector<wasm::LocalSet_*,_2UL>::end(this_00);
      local_70 = IVar7.
                 super_IteratorBase<wasm::SmallVector<wasm::LocalSet_*,_2UL>,_wasm::SmallVector<wasm::LocalSet_*,_2UL>::Iterator>
                 .index;
      local_60 = &this->lattice;
      local_50 = &(this->fakeSetPtrs)._M_h;
      lVar5 = -0x10;
      local_68 = (ulong)IVar7.
                        super_IteratorBase<wasm::SmallVector<wasm::LocalSet_*,_2UL>,_wasm::SmallVector<wasm::LocalSet_*,_2UL>::Iterator>
                        .parent ^ (ulong)this_00;
      pLVar6 = (value_type)&this_00->flexible;
      local_58 = this_00;
      setInstance = pLVar6;
      local_38 = this;
      for (uVar4 = 0; local_70 != uVar4 || local_68 != 0; uVar4 = uVar4 + 1) {
        pLVar2 = pLVar6;
        if (1 < uVar4) {
          pLVar2 = (value_type)
                   (local_58->flexible).
                   super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        }
        local_48 = *(LocalSet **)
                    ((long)&(((_Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)
                             &pLVar2->super_SpecificExpression<(wasm::Expression::Id)9>)->_M_impl).
                            super__Vector_impl_data._M_start + lVar5);
        bVar1 = FinitePowersetLattice<wasm::LocalSet_*>::exists
                          (local_60,(this->
                                    super_VisitorTransferFunc<wasm::analysis::ReachingDefinitionsTransferFunction,_wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_(wasm::analysis::AnalysisDirection)0>
                                    ).currState,local_48);
        if (bVar1) {
          iVar3 = std::
                  _Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::find(local_50,&local_48);
          this_01 = &std::__detail::
                     _Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)this->getSetsMap,&local_80)->
                     super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
          ;
          if (iVar3.super__Node_iterator_base<wasm::LocalSet_*,_false>._M_cur == (__node_type *)0x0)
          {
            x = &local_48;
          }
          else {
            curr_local = (LocalGet *)0x0;
            x = (LocalSet **)&curr_local;
          }
          SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
          ::insert(this_01,x);
          this = local_38;
          pLVar6 = setInstance;
        }
        lVar5 = lVar5 + 8;
      }
    }
    return;
  }
  __assert_fail("currState",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/analysis/reaching-definitions-transfer-function.h"
                ,0x78,
                "void wasm::analysis::ReachingDefinitionsTransferFunction::visitLocalGet(LocalGet *)"
               );
}

Assistant:

void visitLocalGet(LocalGet* curr) {
    assert(currState);

    // This is only to be run in the second phase where we iterate over the
    // final (i.e. solved) states. Thus, only done when collectingResults is
    // true.
    if (collectingResults) {
      auto& matchingSets = indexSetses[curr->index];

      for (auto setInstance : matchingSets) {
        if (lattice.exists(currState, setInstance)) {
          // If a pointer to a real LocalSet, add it, otherwise add a nullptr.
          if (fakeSetPtrs.find(setInstance) == fakeSetPtrs.end()) {
            getSetsMap[curr].insert(setInstance);
          } else {
            getSetsMap[curr].insert(nullptr);
          }
        }
      }
    }
  }